

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxCVar::Resolve(FxCVar *this,FCompileContext *ctx)

{
  int iVar1;
  char *pcVar2;
  FCompileContext *ctx_local;
  FxCVar *this_local;
  
  this_local = this;
  if (((this->super_FxExpression).isresolved & 1U) == 0) {
    (this->super_FxExpression).isresolved = true;
    iVar1 = (*this->CVar->_vptr_FBaseCVar[2])();
    switch(iVar1) {
    case 0:
    case 5:
      (this->super_FxExpression).ValueType = (PType *)TypeBool;
      break;
    case 1:
    case 6:
      (this->super_FxExpression).ValueType = (PType *)TypeSInt32;
      break;
    case 2:
      (this->super_FxExpression).ValueType = (PType *)TypeFloat64;
      break;
    case 3:
      (this->super_FxExpression).ValueType = (PType *)TypeString;
      break;
    case 4:
      (this->super_FxExpression).ValueType = (PType *)TypeColor;
      break;
    default:
      pcVar2 = FBaseCVar::GetName(this->CVar);
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,"Unknown CVar type for %s",pcVar2);
      if (this != (FxCVar *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxCVar *)0x0;
    }
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxCVar::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	switch (CVar->GetRealType())
	{
	case CVAR_Bool:
	case CVAR_DummyBool:
		ValueType = TypeBool;
		break;

	case CVAR_Int:
	case CVAR_DummyInt:
		ValueType = TypeSInt32;
		break;

	case CVAR_Color:
		ValueType = TypeColor;
		break;

	case CVAR_Float:
		ValueType = TypeFloat64;
		break;

	case CVAR_String:
		ValueType = TypeString;
		break;

	default:
		ScriptPosition.Message(MSG_ERROR, "Unknown CVar type for %s", CVar->GetName());
		delete this;
		return nullptr;
	}
	return this;
}